

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagateNoContraction.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_d5791a::TNoContractionAssigneeCheckingTraverser::visitBinary
          (TNoContractionAssigneeCheckingTraverser *this,TVisit param_1,TIntermBinary *node)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  TOperator op;
  undefined4 extraout_var;
  size_type sVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mapped_type *__lhs;
  undefined4 extraout_var_02;
  long lVar5;
  TIntermBinary *local_30;
  TIntermBinary *local_28;
  TIntermBinary *local_20;
  TIntermBinary *node_local;
  TNoContractionAssigneeCheckingTraverser *pTStack_10;
  TVisit param_1_local;
  TNoContractionAssigneeCheckingTraverser *this_local;
  
  local_20 = node;
  node_local._4_4_ = param_1;
  pTStack_10 = this;
  iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar3),this);
  local_28 = local_20;
  sVar4 = std::
          unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(this->accesschain_mapping_,(key_type *)&local_28);
  if (sVar4 != 0) {
    op = glslang::TIntermOperator::getOp(&local_20->super_TIntermOperator);
    bVar1 = isDereferenceOperation(op);
    if (!bVar1) {
      __assert_fail("isDereferenceOperation(node->getOp())",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                    ,0x248,
                    "virtual bool (anonymous namespace)::TNoContractionAssigneeCheckingTraverser::visitBinary(glslang::TVisit, glslang::TIntermBinary *)"
                   );
    }
    iVar3 = (*(local_20->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])();
    bVar1 = isPreciseObjectNode((TIntermTyped *)CONCAT44(extraout_var_00,iVar3));
    if (bVar1) {
      iVar3 = (*(local_20->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x1f])();
      lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x50))();
      *(ulong *)(lVar5 + 8) = *(ulong *)(lVar5 + 8) & 0xffffffefffffffff | 0x1000000000;
    }
    else {
      local_30 = local_20;
      __lhs = std::
              unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at(this->accesschain_mapping_,(key_type *)&local_30);
      _Var2 = std::operator==(__lhs,this->precise_object_);
      if (_Var2) {
        iVar3 = (*(local_20->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1f])();
        lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x50))();
        *(ulong *)(lVar5 + 8) = *(ulong *)(lVar5 + 8) & 0xffffffefffffffff | 0x1000000000;
      }
    }
  }
  return false;
}

Assistant:

bool TNoContractionAssigneeCheckingTraverser::visitBinary(glslang::TVisit,
                                                          glslang::TIntermBinary* node)
{
    // Traverses the left so that we transfer the 'precise' from nesting object
    // to its nested object.
    node->getLeft()->traverse(this);
    // If this binary node is an object node, we should have it in the
    // accesschain_mapping_.
    if (accesschain_mapping_.count(node)) {
        // A binary object node must be a dereference node.
        assert(isDereferenceOperation(node->getOp()));
        // If the left node is 'precise', this node should also be precise,
        // otherwise, compare with the given precise_object_. If the
        // access chain of this node matches with the given precise_object_,
        // this node should be marked as 'precise'.
        if (isPreciseObjectNode(node->getLeft())) {
            node->getWritableType().getQualifier().noContraction = true;
        } else if (accesschain_mapping_.at(node) == *precise_object_) {
            node->getWritableType().getQualifier().noContraction = true;
        }
    }
    return false;
}